

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlNodePtr nodePop(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  uint uVar3;
  xmlNodePtr pxVar4;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->nodeNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->nodeNr = uVar3;
      ppxVar2 = ctxt->nodeTab;
      if (iVar1 == 1) {
        pxVar4 = (xmlNodePtr)0x0;
      }
      else {
        pxVar4 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->node = pxVar4;
      pxVar4 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlNodePtr)0x0;
      return pxVar4;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
nodePop(xmlParserCtxtPtr ctxt)
{
    xmlNodePtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->nodeNr <= 0)
        return (NULL);
    ctxt->nodeNr--;
    if (ctxt->nodeNr > 0)
        ctxt->node = ctxt->nodeTab[ctxt->nodeNr - 1];
    else
        ctxt->node = NULL;
    ret = ctxt->nodeTab[ctxt->nodeNr];
    ctxt->nodeTab[ctxt->nodeNr] = NULL;
    return (ret);
}